

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__vertical_flip_slices(void *image,int w,int h,int z,int bytes_per_pixel)

{
  undefined8 local_30;
  stbi_uc *bytes;
  int slice_size;
  int slice;
  int bytes_per_pixel_local;
  int z_local;
  int h_local;
  int w_local;
  void *image_local;
  
  local_30 = image;
  for (bytes._4_4_ = 0; bytes._4_4_ < z; bytes._4_4_ = bytes._4_4_ + 1) {
    stbi__vertical_flip(local_30,w,h,bytes_per_pixel);
    local_30 = (void *)((long)local_30 + (long)(w * h * bytes_per_pixel));
  }
  return;
}

Assistant:

static void stbi__vertical_flip_slices(void *image, int w, int h, int z, int bytes_per_pixel)
{
   int slice;
   int slice_size = w * h * bytes_per_pixel;

   stbi_uc *bytes = (stbi_uc *)image;
   for (slice = 0; slice < z; ++slice) {
      stbi__vertical_flip(bytes, w, h, bytes_per_pixel); 
      bytes += slice_size; 
   }
}